

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O0

void ga_add_patch_(void *alpha,Integer *g_a,Integer *ailo,Integer *aihi,Integer *ajlo,Integer *ajhi,
                  void *beta,Integer *g_b,Integer *bilo,Integer *bihi,Integer *bjlo,Integer *bjhi,
                  Integer *g_c,Integer *cilo,Integer *cihi,Integer *cjlo,Integer *cjhi)

{
  Integer *in_RDX;
  Integer *unaff_RBX;
  Integer *in_RSI;
  Integer *in_RDI;
  Integer unaff_R12;
  void *unaff_R13;
  void *unaff_retaddr;
  Integer in_stack_00000008;
  Integer *in_stack_00000010;
  Integer *in_stack_00000018;
  Integer *in_stack_00000020;
  Integer *in_stack_00000028;
  Integer in_stack_00000030;
  Integer *in_stack_00000038;
  Integer *in_stack_00000040;
  Integer *in_stack_00000048;
  Integer *in_stack_00000050;
  
  sga_add_patch(unaff_R13,unaff_R12,unaff_RBX,in_RDI,in_RSI,in_RDX,unaff_retaddr,in_stack_00000008,
                in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
                in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048,
                in_stack_00000050);
  return;
}

Assistant:

void FATR ga_add_patch_(void *alpha, Integer *g_a, Integer *ailo, Integer *aihi, Integer *ajlo, Integer *ajhi, void *beta, Integer *g_b, Integer *bilo, Integer *bihi, Integer *bjlo, Integer *bjhi, Integer *g_c, Integer *cilo, Integer *cihi, Integer *cjlo, Integer *cjhi)
{
    sga_add_patch(alpha, *g_a, ailo, aihi, ajlo, ajhi, beta, *g_b, bilo, bihi, bjlo, bjhi, *g_c, cilo, cihi, cjlo, cjhi);
}